

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::showMenu(QToolButton *this)

{
  bool bVar1;
  QToolButtonPrivate *this_00;
  QWidget *in_RDI;
  QToolButtonPrivate *d;
  QToolButtonPrivate *in_stack_000000c0;
  
  this_00 = d_func((QToolButton *)0x70af7b);
  bVar1 = QToolButtonPrivate::hasMenu(this_00);
  if (bVar1) {
    if (((byte)this_00->field_0x2ec >> 2 & 1) == 0) {
      this_00->field_0x2ec = this_00->field_0x2ec & 0xfb | 4;
      QWidget::repaint(in_RDI);
      QBasicTimer::stop();
      QToolButtonPrivate::popupTimerDone(in_stack_000000c0);
    }
  }
  else {
    this_00->field_0x2ec = this_00->field_0x2ec & 0xfb;
  }
  return;
}

Assistant:

void QToolButton::showMenu()
{
    Q_D(QToolButton);
    if (!d->hasMenu()) {
        d->menuButtonDown = false;
        return; // no menu to show
    }
    // prevent recursions spinning another event loop
    if (d->menuButtonDown)
        return;


    d->menuButtonDown = true;
    repaint();
    d->popupTimer.stop();
    d->popupTimerDone();
}